

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

bool crnlib::rg_etc1::unpack_etc2_alpha(void *pBlock,uint *pDst_pixels_rgba,int comp_index)

{
  byte bVar1;
  byte bVar2;
  sbyte sVar3;
  uint uVar4;
  ulong uVar5;
  uint i;
  uint d0;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined1 auStack_10 [8];
  uint8 values [8];
  
  bVar1 = *(byte *)((long)pBlock + 1);
  bVar2 = *pBlock;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    iVar9 = *(int *)((long)&g_etc2a_modifier_table + lVar7 * 4 + (ulong)((bVar1 & 0xf) << 5)) *
            (uint)(bVar1 >> 4) + (uint)bVar2;
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    auStack_10[lVar7] = (char)iVar9;
  }
  iVar6 = 3;
  for (iVar9 = 0; iVar9 != 4; iVar9 = iVar9 + 1) {
    for (iVar8 = 0; iVar8 != 0x30; iVar8 = iVar8 + 0xc) {
      uVar5 = (ulong)((uint)(iVar6 + iVar8) >> 3);
      uVar4 = iVar6 + iVar8 & 7;
      sVar3 = (sbyte)uVar4;
      uVar10 = (uint)(*(byte *)((long)pBlock + uVar5 + 2) >> (8U - sVar3 & 0x1f));
      if (uVar4 < 3) {
        uVar10 = (uint)*(byte *)((long)pBlock + uVar5 + 1) << sVar3 | uVar10;
      }
      *(undefined1 *)((long)pDst_pixels_rgba + (long)comp_index) = auStack_10[uVar10 & 7];
      pDst_pixels_rgba = pDst_pixels_rgba + 1;
    }
    iVar6 = iVar6 + 3;
  }
  return true;
}

Assistant:

bool unpack_etc2_alpha(const void* pBlock, unsigned int* pDst_pixels_rgba, int comp_index) {
  color_quad_u8* pDst = (color_quad_u8*)pDst_pixels_rgba;
  const uint8* B = (const uint8*)pBlock;
  const int* modifier = g_etc2a_modifier_table[B[1] & 0xF];
  uint8 values[8];
  for (int base_codeword = B[0], multiplier = B[1] >> 4, i = 0; i < 8; i++)
    values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
  for (uint d0 = 3, i = 0; i < 4; i++, d0 += 3) {
    for (uint d = d0, j = 0; j < 4; j++, pDst++, d += 12) {
      int byte_offset = 2 + (d >> 3);
      int bit_offset = d & 7;
      int s = B[byte_offset] >> (8 - bit_offset) & 7;
      if (bit_offset < 3)
        s |= B[byte_offset - 1] << bit_offset & 7;
      pDst->c[comp_index] = values[s];
    }
  }
  return true;
}